

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_pandore
          (CImg<unsigned_char> *this,FILE *file,char *filename)

{
  ushort *puVar1;
  char cVar2;
  uchar uVar3;
  float fVar4;
  uchar *puVar5;
  uint uVar6;
  uint uVar7;
  unsigned_short *ptr;
  FILE *__stream;
  size_t sVar8;
  size_t sVar9;
  uint *puVar10;
  float *pfVar11;
  float *pfVar12;
  uint *puVar13;
  CImgArgumentException *this_00;
  CImgIOException *pCVar14;
  long lVar15;
  int *piVar16;
  size_t to_read;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  char *pcVar20;
  char cVar21;
  long lVar22;
  pointer_____offset_0x10___ *ppuVar23;
  char cVar24;
  char *pcVar25;
  size_t al_read_1;
  void *pvVar26;
  size_t al_read;
  long lVar27;
  ulong uVar28;
  uint dims [8];
  uint imageid;
  int ptbuf [4];
  CImg<char> header;
  
  uVar7 = imageid;
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar25 = "non-";
    if (this->_is_shared != false) {
      pcVar25 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pandore(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar25,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  __stream = (FILE *)file;
  if (file == (FILE *)0x0) {
    __stream = cimg::fopen(filename,"rb");
  }
  CImg<char>::CImg(&header,0x20,1,1,1);
  pcVar25 = header._data;
  if ((__stream == (FILE *)0x0) || (header._data == (char *)0x0)) {
    pCVar14 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)pCVar14,
               "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",0xc,
               "char","s",__stream,header._data);
    ppuVar23 = &CImgArgumentException::typeinfo;
LAB_001b1e72:
    __cxa_throw(pCVar14,ppuVar23,CImgException::~CImgException);
  }
  uVar17 = 0xc;
  lVar27 = 0;
  do {
    sVar18 = 0x3f00000;
    if (uVar17 < 0x3f00000) {
      sVar18 = uVar17;
    }
    sVar8 = fread(pcVar25 + lVar27,1,sVar18,__stream);
    lVar27 = lVar27 + sVar8;
    uVar17 = uVar17 - sVar8;
  } while ((sVar18 == sVar8) && (uVar17 != 0));
  if (uVar17 != 0) {
    cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,0xc);
  }
  lVar27 = 0;
  do {
    cVar2 = "PANDORE"[lVar27];
    cVar21 = cVar2 + ' ';
    if ((byte)(cVar2 + 0xa5U) < 0xe6) {
      cVar21 = cVar2;
    }
    cVar2 = header._data[lVar27];
    cVar24 = cVar2 + ' ';
    if ((byte)(cVar2 + 0xa5U) < 0xe6) {
      cVar24 = cVar2;
    }
    if (cVar21 != cVar24) goto LAB_001ae687;
    lVar27 = lVar27 + 1;
  } while ((int)lVar27 != 7);
  lVar27 = 7;
LAB_001ae687:
  if (cVar21 != cVar24 && (int)lVar27 != 7) {
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    pCVar14 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar25 = "non-";
    if (this->_is_shared != false) {
      pcVar25 = "";
    }
    pcVar20 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar20 = filename;
    }
    CImgIOException::CImgIOException
              (pCVar14,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pandore(): PANDORE header not found in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar25,"unsigned char",pcVar20);
    ppuVar23 = &CImgIOException::typeinfo;
    goto LAB_001b1e72;
  }
  dims[4] = 0;
  dims[5] = 0;
  dims[6] = 0;
  dims[7] = 0;
  dims[0] = 0;
  dims[1] = 0;
  dims[2] = 0;
  dims[3] = 0;
  ptbuf[0] = 0;
  ptbuf[1] = 0;
  ptbuf[2] = 0;
  ptbuf[3] = 0;
  sVar18 = 1;
  lVar27 = 0;
  do {
    sVar8 = 0xfc0000;
    if (sVar18 * 4 < 0x3f00000) {
      sVar8 = sVar18;
    }
    sVar9 = fread(ptbuf + lVar27 + -1,4,sVar8,__stream);
    lVar27 = lVar27 + sVar9;
    sVar18 = sVar18 - sVar9;
  } while ((sVar8 == sVar9) && (sVar18 != 0));
  if (sVar18 != 0) {
    cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,1);
  }
  pcVar25 = header._data;
  if (0xff < imageid) {
    imageid = imageid >> 0x18 | (imageid & 0xff0000) >> 8 | (imageid & 0xff00) << 8 |
              imageid << 0x18;
  }
  if (header._data == (char *)0x0) {
    pCVar14 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)pCVar14,
               "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",0x14,
               "char","s",__stream,0);
    ppuVar23 = &CImgArgumentException::typeinfo;
LAB_001b1ec6:
    __cxa_throw(pCVar14,ppuVar23,CImgException::~CImgException);
  }
  uVar17 = 0x14;
  lVar27 = 0;
  do {
    sVar18 = 0x3f00000;
    if (uVar17 < 0x3f00000) {
      sVar18 = uVar17;
    }
    sVar8 = fread(pcVar25 + lVar27,1,sVar18,__stream);
    lVar27 = lVar27 + sVar8;
    uVar17 = uVar17 - sVar8;
  } while ((sVar18 == sVar8) && (uVar17 != 0));
  if (uVar17 != 0) {
    cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,0x14);
  }
  switch(imageid) {
  case 2:
    sVar18 = 2;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,2);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 2;
      do {
        uVar7 = puVar10[-1];
        puVar10[-1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[1],1,1,1);
    uVar17 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar10 = (uint *)operator_new__(uVar17);
    if (uVar17 != 0) {
      lVar27 = 0;
      uVar28 = uVar17;
      do {
        sVar18 = 0x3f00000;
        if (uVar28 < 0x3f00000) {
          sVar18 = uVar28;
        }
        sVar8 = fread((uchar *)((long)puVar10 + lVar27),1,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar28 = uVar28 - sVar8;
      } while ((sVar18 == sVar8) && (uVar28 != 0));
      if (uVar28 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar17);
      }
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        puVar5[lVar15] = *(uchar *)((long)puVar10 + lVar15);
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
LAB_001b1598:
      puVar10 = (uint *)((long)puVar10 + lVar15);
    }
    goto LAB_001b159b;
  case 3:
    sVar18 = 2;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,2);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 2;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[1],1,1,1);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        uVar3 = *(uchar *)pfVar11;
        pfVar11 = pfVar11 + 1;
        puVar5[lVar15] = uVar3;
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
    }
    break;
  case 4:
    sVar18 = 2;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,2);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 2;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[1],1,1,1);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        fVar4 = *pfVar11;
        pfVar11 = pfVar11 + 1;
        puVar5[lVar15] = (uchar)(int)fVar4;
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
    }
    break;
  case 5:
    sVar18 = 3;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,3);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 3;
      do {
        uVar7 = puVar10[-1];
        puVar10[-1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[2],dims[1],1,1);
    uVar17 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar10 = (uint *)operator_new__(uVar17);
    if (uVar17 != 0) {
      lVar27 = 0;
      uVar28 = uVar17;
      do {
        sVar18 = 0x3f00000;
        if (uVar28 < 0x3f00000) {
          sVar18 = uVar28;
        }
        sVar8 = fread((uchar *)((long)puVar10 + lVar27),1,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar28 = uVar28 - sVar8;
      } while ((sVar18 == sVar8) && (uVar28 != 0));
      if (uVar28 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar17);
      }
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        puVar5[lVar15] = *(uchar *)((long)puVar10 + lVar15);
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
      goto LAB_001b1598;
    }
    goto LAB_001b159b;
  case 6:
    sVar18 = 3;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,3);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 3;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[2],dims[1],1,1);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        uVar3 = *(uchar *)pfVar11;
        pfVar11 = pfVar11 + 1;
        puVar5[lVar15] = uVar3;
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
    }
    break;
  case 7:
    sVar18 = 3;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,3);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 3;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[2],dims[1],1,1);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        fVar4 = *pfVar11;
        pfVar11 = pfVar11 + 1;
        puVar5[lVar15] = (uchar)(int)fVar4;
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
    }
    break;
  case 8:
    sVar18 = 4;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,4);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 4;
      do {
        uVar7 = puVar10[-1];
        puVar10[-1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[3],dims[2],dims[1],1);
    uVar17 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar10 = (uint *)operator_new__(uVar17);
    if (uVar17 != 0) {
      lVar27 = 0;
      uVar28 = uVar17;
      do {
        sVar18 = 0x3f00000;
        if (uVar28 < 0x3f00000) {
          sVar18 = uVar28;
        }
        sVar8 = fread((uchar *)((long)puVar10 + lVar27),1,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar28 = uVar28 - sVar8;
      } while ((sVar18 == sVar8) && (uVar28 != 0));
      if (uVar28 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar17);
      }
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        puVar5[lVar15] = *(uchar *)((long)puVar10 + lVar15);
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
      goto LAB_001b1598;
    }
    goto LAB_001b159b;
  case 9:
    sVar18 = 4;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,4);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 4;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[3],dims[2],dims[1],1);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        uVar3 = *(uchar *)pfVar11;
        pfVar11 = pfVar11 + 1;
        puVar5[lVar15] = uVar3;
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
    }
    break;
  case 10:
    sVar18 = 4;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,4);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 4;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[3],dims[2],dims[1],1);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        fVar4 = *pfVar11;
        pfVar11 = pfVar11 + 1;
        puVar5[lVar15] = (uchar)(int)fVar4;
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
    }
    break;
  case 0xb:
    sVar18 = 3;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,3);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 3;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[1],1,1,1);
    uVar6 = this->_spectrum * this->_depth * this->_height * this->_width;
    if (dims[2] < 0x100) {
      uVar17 = (ulong)uVar6;
      puVar10 = (uint *)operator_new__(uVar17);
      cimg::fread<unsigned_char>((uchar *)puVar10,uVar17,(FILE *)__stream);
      lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
               (ulong)this->_height * (ulong)this->_width;
      if (lVar27 != 0) {
        puVar5 = this->_data;
        lVar15 = 0;
        do {
          puVar5[lVar15] = *(uchar *)((long)puVar10 + lVar15);
          lVar15 = lVar15 + 1;
        } while (lVar27 - lVar15 != 0);
        goto LAB_001b1598;
      }
    }
    else {
      uVar28 = (ulong)uVar6;
      if (dims[2] < 0x10000) {
        uVar17 = uVar28 * 2;
        puVar10 = (uint *)operator_new__(uVar17);
        cimg::fread<unsigned_short>((unsigned_short *)puVar10,uVar28,(FILE *)__stream);
        if ((0xff < uVar7) && (uVar28 != 0)) {
          puVar13 = (uint *)(uVar28 * 2 + (long)puVar10);
          do {
            puVar1 = (ushort *)((long)puVar13 + -2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            puVar13 = (uint *)((long)puVar13 + -2);
          } while (puVar10 < puVar13);
        }
        lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
                 (ulong)this->_height * (ulong)this->_width;
        if (lVar27 != 0) {
          puVar5 = this->_data;
          lVar15 = 0;
          do {
            uVar7 = *puVar10;
            puVar10 = (uint *)((long)puVar10 + 2);
            puVar5[lVar15] = (uchar)uVar7;
            lVar15 = lVar15 + 1;
          } while (lVar27 - lVar15 != 0);
        }
      }
      else {
        uVar17 = uVar28 * 4;
        puVar10 = (uint *)operator_new__(uVar17);
        cimg::fread<unsigned_int>(puVar10,uVar28,(FILE *)__stream);
        if ((0xff < uVar7) && (uVar28 != 0)) {
          puVar13 = puVar10 + uVar28;
          do {
            uVar7 = puVar13[-1];
            puVar13[-1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                          uVar7 << 0x18;
            puVar13 = puVar13 + -1;
          } while (puVar10 < puVar13);
        }
        lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
                 (ulong)this->_height * (ulong)this->_width;
        if (lVar27 != 0) {
          puVar5 = this->_data;
          lVar15 = 0;
          do {
            uVar7 = *puVar10;
            puVar10 = puVar10 + 1;
            puVar5[lVar15] = (uchar)uVar7;
            lVar15 = lVar15 + 1;
          } while (lVar27 - lVar15 != 0);
        }
      }
    }
    goto LAB_001b159b;
  case 0xc:
    sVar18 = 4;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,4);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 4;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[2],dims[1],1,1);
    uVar17 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (0xff < dims[3]) {
      if (dims[3] < 0x10000) {
        uVar28 = uVar17 * 2;
        uVar19 = 0xffffffffffffffff;
        if (-1 < (long)uVar17) {
          uVar19 = uVar28;
        }
        puVar10 = (uint *)operator_new__(uVar19);
        cimg::fread<unsigned_short>((unsigned_short *)puVar10,uVar17,(FILE *)__stream);
        if ((0xff < uVar7) && (0 < (long)uVar17)) {
          puVar13 = (uint *)(uVar17 * 2 + (long)puVar10);
          do {
            puVar1 = (ushort *)((long)puVar13 + -2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            puVar13 = (uint *)((long)puVar13 + -2);
          } while (puVar10 < puVar13);
        }
        lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
                 (ulong)this->_height * (ulong)this->_width;
        if (lVar27 != 0) {
          puVar5 = this->_data;
          lVar15 = 0;
          do {
            uVar7 = *puVar10;
            puVar10 = (uint *)((long)puVar10 + 2);
            puVar5[lVar15] = (uchar)uVar7;
            lVar15 = lVar15 + 1;
          } while (lVar27 - lVar15 != 0);
        }
      }
      else {
        uVar28 = uVar17 * 4;
        puVar10 = (uint *)operator_new__(-(ulong)(uVar17 >> 0x3e != 0) | uVar28);
        cimg::fread<unsigned_int>(puVar10,uVar17,(FILE *)__stream);
        if ((0xff < uVar7) && (0 < (long)uVar17)) {
          puVar13 = puVar10 + uVar17;
          do {
            uVar7 = puVar13[-1];
            puVar13[-1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                          uVar7 << 0x18;
            puVar13 = puVar13 + -1;
          } while (puVar10 < puVar13);
        }
        lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
                 (ulong)this->_height * (ulong)this->_width;
        if (lVar27 != 0) {
          puVar5 = this->_data;
          lVar15 = 0;
          lVar22 = 0;
          do {
            puVar5[lVar22] = (uchar)puVar10[lVar22];
            lVar22 = lVar22 + 1;
            lVar15 = lVar15 + -4;
          } while (lVar27 - lVar22 != 0);
          goto LAB_001b1d29;
        }
      }
      goto LAB_001b1d2c;
    }
    puVar10 = (uint *)operator_new__(uVar17);
    cimg::fread<unsigned_char>((uchar *)puVar10,uVar17,(FILE *)__stream);
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        puVar5[lVar15] = *(uchar *)((long)puVar10 + lVar15);
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
      goto LAB_001b1598;
    }
    goto LAB_001b159b;
  case 0xd:
    sVar18 = 5;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,5);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 5;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[3],dims[2],dims[1],1);
    uVar17 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (dims[4] < 0x100) {
      puVar10 = (uint *)operator_new__(uVar17);
      cimg::fread<unsigned_char>((uchar *)puVar10,uVar17,(FILE *)__stream);
      lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
               (ulong)this->_height * (ulong)this->_width;
      if (lVar27 != 0) {
        puVar5 = this->_data;
        lVar15 = 0;
        do {
          puVar5[lVar15] = *(uchar *)((long)puVar10 + lVar15);
          lVar15 = lVar15 + 1;
        } while (lVar27 - lVar15 != 0);
        goto LAB_001b1598;
      }
      goto LAB_001b159b;
    }
    if (dims[4] < 0x10000) {
      uVar28 = uVar17 * 2;
      uVar19 = 0xffffffffffffffff;
      if (-1 < (long)uVar17) {
        uVar19 = uVar28;
      }
      puVar10 = (uint *)operator_new__(uVar19);
      cimg::fread<unsigned_short>((unsigned_short *)puVar10,uVar17,(FILE *)__stream);
      if ((0xff < uVar7) && (0 < (long)uVar17)) {
        puVar13 = (uint *)(uVar17 * 2 + (long)puVar10);
        do {
          puVar1 = (ushort *)((long)puVar13 + -2);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          puVar13 = (uint *)((long)puVar13 + -2);
        } while (puVar10 < puVar13);
      }
      lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
               (ulong)this->_height * (ulong)this->_width;
      if (lVar27 != 0) {
        puVar5 = this->_data;
        lVar15 = 0;
        lVar22 = 0;
        do {
          puVar5[lVar22] = (uchar)*(unsigned_short *)((long)puVar10 + lVar22 * 2);
          lVar22 = lVar22 + 1;
          lVar15 = lVar15 + -2;
        } while (lVar27 - lVar22 != 0);
LAB_001b1d29:
        puVar10 = (uint *)((long)puVar10 - lVar15);
      }
    }
    else {
      uVar28 = uVar17 * 4;
      puVar10 = (uint *)operator_new__(-(ulong)(uVar17 >> 0x3e != 0) | uVar28);
      cimg::fread<unsigned_int>(puVar10,uVar17,(FILE *)__stream);
      if ((0xff < uVar7) && (0 < (long)uVar17)) {
        puVar13 = puVar10 + uVar17;
        do {
          uVar7 = puVar13[-1];
          puVar13[-1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                        uVar7 << 0x18;
          puVar13 = puVar13 + -1;
        } while (puVar10 < puVar13);
      }
      lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
               (ulong)this->_height * (ulong)this->_width;
      if (lVar27 != 0) {
        puVar5 = this->_data;
        lVar15 = 0;
        lVar22 = 0;
        do {
          puVar5[lVar22] = (uchar)puVar10[lVar22];
          lVar22 = lVar22 + 1;
          lVar15 = lVar15 + -4;
        } while (lVar27 - lVar22 != 0);
        goto LAB_001b1d29;
      }
    }
LAB_001b1d2c:
    pvVar26 = (void *)((long)puVar10 - uVar28);
    goto LAB_001b1911;
  default:
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    pCVar14 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar25 = "non-";
    if (this->_is_shared != false) {
      pcVar25 = "";
    }
    pcVar20 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar20 = filename;
    }
    CImgIOException::CImgIOException
              (pCVar14,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pandore(): Unable to load data with ID_type %u in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar25,"unsigned char",(ulong)imageid,pcVar20);
    ppuVar23 = &CImgIOException::typeinfo;
    goto LAB_001b1ec6;
  case 0x10:
    sVar18 = 4;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,4);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 4;
      do {
        uVar7 = puVar10[-1];
        puVar10[-1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[2],dims[1],1,3);
    uVar17 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar10 = (uint *)operator_new__(uVar17);
    if (uVar17 != 0) {
      lVar27 = 0;
      uVar28 = uVar17;
      do {
        sVar18 = 0x3f00000;
        if (uVar28 < 0x3f00000) {
          sVar18 = uVar28;
        }
        sVar8 = fread((uchar *)((long)puVar10 + lVar27),1,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar28 = uVar28 - sVar8;
      } while ((sVar18 == sVar8) && (uVar28 != 0));
      if (uVar28 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar17);
      }
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        puVar5[lVar15] = *(uchar *)((long)puVar10 + lVar15);
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
      goto LAB_001b1598;
    }
    goto LAB_001b159b;
  case 0x11:
    sVar18 = 4;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,4);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 4;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[2],dims[1],1,3);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      lVar22 = 0;
      do {
        puVar5[lVar22] = *(uchar *)(pfVar11 + lVar22);
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + -4;
      } while (lVar27 - lVar22 != 0);
LAB_001b1908:
      pfVar11 = (float *)((long)pfVar11 - lVar15);
    }
    break;
  case 0x12:
    sVar18 = 4;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,4);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 4;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[2],dims[1],1,3);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      lVar22 = 0;
      do {
        puVar5[lVar22] = (uchar)(int)pfVar11[lVar22];
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + -4;
      } while (lVar27 - lVar22 != 0);
      goto LAB_001b1908;
    }
    break;
  case 0x13:
    sVar18 = 5;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,5);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 5;
      do {
        uVar7 = puVar10[-1];
        puVar10[-1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[3],dims[2],dims[1],3);
    uVar17 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar10 = (uint *)operator_new__(uVar17);
    if (uVar17 != 0) {
      lVar27 = 0;
      uVar28 = uVar17;
      do {
        sVar18 = 0x3f00000;
        if (uVar28 < 0x3f00000) {
          sVar18 = uVar28;
        }
        sVar8 = fread((uchar *)((long)puVar10 + lVar27),1,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar28 = uVar28 - sVar8;
      } while ((sVar18 == sVar8) && (uVar28 != 0));
      if (uVar28 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar17);
      }
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        puVar5[lVar15] = *(uchar *)((long)puVar10 + lVar15);
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
      goto LAB_001b1598;
    }
    goto LAB_001b159b;
  case 0x14:
    sVar18 = 5;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,5);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 5;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[3],dims[2],dims[1],3);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      lVar22 = 0;
      do {
        puVar5[lVar22] = *(uchar *)(pfVar11 + lVar22);
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + -4;
      } while (lVar27 - lVar22 != 0);
      goto LAB_001b1908;
    }
    break;
  case 0x15:
    sVar18 = 5;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,5);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 5;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[3],dims[2],dims[1],3);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      lVar22 = 0;
      do {
        puVar5[lVar22] = (uchar)(int)pfVar11[lVar22];
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + -4;
      } while (lVar27 - lVar22 != 0);
      goto LAB_001b1908;
    }
    break;
  case 0x16:
    sVar18 = 2;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,2);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 2;
      do {
        uVar7 = puVar10[-1];
        puVar10[-1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[1],1,1,dims[0]);
    uVar17 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar10 = (uint *)operator_new__(uVar17);
    if (uVar17 != 0) {
      lVar27 = 0;
      uVar28 = uVar17;
      do {
        sVar18 = 0x3f00000;
        if (uVar28 < 0x3f00000) {
          sVar18 = uVar28;
        }
        sVar8 = fread((uchar *)((long)puVar10 + lVar27),1,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar28 = uVar28 - sVar8;
      } while ((sVar18 == sVar8) && (uVar28 != 0));
      if (uVar28 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar17);
      }
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        puVar5[lVar15] = *(uchar *)((long)puVar10 + lVar15);
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
      goto LAB_001b1598;
    }
    goto LAB_001b159b;
  case 0x17:
    sVar18 = 2;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,2);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 2;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[1],1,1,dims[0]);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      lVar22 = 0;
      do {
        puVar5[lVar22] = *(uchar *)(pfVar11 + lVar22);
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + -4;
      } while (lVar27 - lVar22 != 0);
      goto LAB_001b1908;
    }
    break;
  case 0x18:
    sVar18 = 2;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,2);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 2;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[1],1,1,dims[0]);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      lVar22 = 0;
      do {
        puVar5[lVar22] = *(uchar *)(pfVar11 + lVar22);
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + -4;
      } while (lVar27 - lVar22 != 0);
      goto LAB_001b1908;
    }
    break;
  case 0x19:
    sVar18 = 2;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,2);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 2;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[1],1,1,dims[0]);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      lVar22 = 0;
      do {
        puVar5[lVar22] = (uchar)(int)pfVar11[lVar22];
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + -4;
      } while (lVar27 - lVar22 != 0);
      goto LAB_001b1908;
    }
    break;
  case 0x1a:
    sVar18 = 3;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,3);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 3;
      do {
        uVar7 = puVar10[-1];
        puVar10[-1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[2],dims[1],1,dims[0]);
    uVar17 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar10 = (uint *)operator_new__(uVar17);
    if (uVar17 != 0) {
      lVar27 = 0;
      uVar28 = uVar17;
      do {
        sVar18 = 0x3f00000;
        if (uVar28 < 0x3f00000) {
          sVar18 = uVar28;
        }
        sVar8 = fread((uchar *)((long)puVar10 + lVar27),1,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar28 = uVar28 - sVar8;
      } while ((sVar18 == sVar8) && (uVar28 != 0));
      if (uVar28 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar17);
      }
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        puVar5[lVar15] = *(uchar *)((long)puVar10 + lVar15);
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
      goto LAB_001b1598;
    }
    goto LAB_001b159b;
  case 0x1b:
    sVar18 = 3;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,3);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 3;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[2],dims[1],1,dims[0]);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      lVar22 = 0;
      do {
        puVar5[lVar22] = *(uchar *)(pfVar11 + lVar22);
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + -4;
      } while (lVar27 - lVar22 != 0);
      goto LAB_001b1908;
    }
    break;
  case 0x1c:
    sVar18 = 3;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,3);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 3;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[2],dims[1],1,dims[0]);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      lVar22 = 0;
      do {
        puVar5[lVar22] = *(uchar *)(pfVar11 + lVar22);
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + -4;
      } while (lVar27 - lVar22 != 0);
      goto LAB_001b1908;
    }
    break;
  case 0x1d:
    sVar18 = 3;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,3);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 3;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[2],dims[1],1,dims[0]);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      lVar22 = 0;
      do {
        puVar5[lVar22] = (uchar)(int)pfVar11[lVar22];
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + -4;
      } while (lVar27 - lVar22 != 0);
      goto LAB_001b1908;
    }
    break;
  case 0x1e:
    sVar18 = 4;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,4);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 4;
      do {
        uVar7 = puVar10[-1];
        puVar10[-1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[3],dims[2],dims[1],dims[0]);
    uVar17 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar10 = (uint *)operator_new__(uVar17);
    if (uVar17 != 0) {
      lVar27 = 0;
      uVar28 = uVar17;
      do {
        sVar18 = 0x3f00000;
        if (uVar28 < 0x3f00000) {
          sVar18 = uVar28;
        }
        sVar8 = fread((uchar *)((long)puVar10 + lVar27),1,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar28 = uVar28 - sVar8;
      } while ((sVar18 == sVar8) && (uVar28 != 0));
      if (uVar28 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar17);
      }
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      do {
        puVar5[lVar15] = *(uchar *)((long)puVar10 + lVar15);
        lVar15 = lVar15 + 1;
      } while (lVar27 - lVar15 != 0);
      goto LAB_001b1598;
    }
LAB_001b159b:
    pvVar26 = (void *)((long)puVar10 - uVar17);
    goto LAB_001b1911;
  case 0x1f:
    sVar18 = 4;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,4);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 4;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[3],dims[2],dims[1],dims[0]);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      lVar22 = 0;
      do {
        puVar5[lVar22] = *(uchar *)(pfVar11 + lVar22);
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + -4;
      } while (lVar27 - lVar22 != 0);
      goto LAB_001b1908;
    }
    break;
  case 0x20:
    sVar18 = 4;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,4);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 4;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[3],dims[2],dims[1],dims[0]);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      lVar22 = 0;
      do {
        puVar5[lVar22] = *(uchar *)(pfVar11 + lVar22);
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + -4;
      } while (lVar27 - lVar22 != 0);
      goto LAB_001b1908;
    }
    break;
  case 0x21:
    sVar18 = 4;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(dims + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,4);
    }
    if (0xff < uVar7) {
      puVar10 = dims + 4;
      do {
        uVar6 = puVar10[-1];
        puVar10[-1] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
        puVar10 = puVar10 + -1;
      } while (dims < puVar10);
    }
    assign(this,dims[3],dims[2],dims[1],dims[0]);
    uVar28 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar17 = uVar28 * 4;
    pfVar11 = (float *)operator_new__(-(ulong)(uVar28 >> 0x3e != 0) | uVar17);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar19 = uVar28;
      do {
        sVar18 = 0xfc0000;
        if (uVar19 * 4 < 0x3f00000) {
          sVar18 = uVar19;
        }
        sVar8 = fread(pfVar11 + lVar27,4,sVar18,__stream);
        lVar27 = lVar27 + sVar8;
        uVar19 = uVar19 - sVar8;
      } while ((sVar18 == sVar8) && (uVar19 != 0));
      if (uVar19 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,uVar28);
      }
    }
    if ((0xff < uVar7) && (0 < (long)uVar28)) {
      pfVar12 = pfVar11 + uVar28;
      do {
        fVar4 = pfVar12[-1];
        pfVar12[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                              ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
        pfVar12 = pfVar12 + -1;
      } while (pfVar11 < pfVar12);
    }
    lVar27 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar27 != 0) {
      puVar5 = this->_data;
      lVar15 = 0;
      lVar22 = 0;
      do {
        puVar5[lVar22] = (uchar)(int)pfVar11[lVar22];
        lVar22 = lVar22 + 1;
        lVar15 = lVar15 + -4;
      } while (lVar27 - lVar22 != 0);
      goto LAB_001b1908;
    }
    break;
  case 0x22:
    sVar18 = 1;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(ptbuf + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,1);
    }
    if (0xff < uVar7) {
      ptbuf[0] = (uint)ptbuf[0] >> 0x18 | (ptbuf[0] & 0xff0000U) >> 8 | (ptbuf[0] & 0xff00U) << 8 |
                 ptbuf[0] << 0x18;
    }
    assign(this,1,1,1,1);
    *this->_data = (uchar)ptbuf[0];
    goto LAB_001b1916;
  case 0x23:
    sVar18 = 2;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(ptbuf + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,2);
    }
    if (0xff < uVar7) {
      piVar16 = ptbuf + 2;
      do {
        uVar7 = piVar16[-1];
        piVar16[-1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18;
        piVar16 = piVar16 + -1;
      } while (ptbuf < piVar16);
    }
    assign(this,2,1,1,1);
    *this->_data = (uchar)ptbuf[1];
    this->_data[1] = (uchar)ptbuf[0];
    goto LAB_001b1916;
  case 0x24:
    sVar18 = 3;
    lVar27 = 0;
    do {
      sVar8 = 0xfc0000;
      if (sVar18 * 4 < 0x3f00000) {
        sVar8 = sVar18;
      }
      sVar9 = fread(ptbuf + lVar27,4,sVar8,__stream);
      lVar27 = lVar27 + sVar9;
      sVar18 = sVar18 - sVar9;
    } while ((sVar8 == sVar9) && (sVar18 != 0));
    if (sVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar27,3);
    }
    if (0xff < uVar7) {
      piVar16 = ptbuf + 3;
      do {
        uVar7 = piVar16[-1];
        piVar16[-1] = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18;
        piVar16 = piVar16 + -1;
      } while (ptbuf < piVar16);
    }
    assign(this,3,1,1,1);
    *this->_data = (uchar)ptbuf[2];
    this->_data[1] = (uchar)ptbuf[1];
    this->_data[2] = (uchar)ptbuf[0];
    goto LAB_001b1916;
  }
  pvVar26 = (void *)((long)pfVar11 - uVar17);
LAB_001b1911:
  operator_delete__(pvVar26);
LAB_001b1916:
  if (file == (FILE *)0x0) {
    if (__stream == (FILE *)0x0) {
      cimg::warn("cimg::fclose(): Specified file is (null).");
    }
    else if (((_stdin != __stream) && (_stdout != __stream)) &&
            (uVar7 = fclose(__stream), uVar7 != 0)) {
      cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar7);
    }
  }
  if ((header._is_shared == false) && (header._data != (char *)0x0)) {
    operator_delete__(header._data);
  }
  return this;
}

Assistant:

CImg<T>& _load_pandore(std::FILE *const file, const char *const filename) {
#define __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,ndim,stype) \
        cimg::fread(dims,nbdim,nfile); \
        if (endian) cimg::invert_endianness(dims,nbdim); \
        assign(nwidth,nheight,ndepth,ndim); \
        const size_t siz = size(); \
        stype *buffer = new stype[siz]; \
        cimg::fread(buffer,siz,nfile); \
        if (endian) cimg::invert_endianness(buffer,siz); \
        T *ptrd = _data; \
        cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++); \
        buffer-=siz; \
        delete[] buffer

#define _cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype1,stype2,stype3,ltype) { \
        if (sizeof(stype1)==ltype) { __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype1); } \
        else if (sizeof(stype2)==ltype) { __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype2); } \
        else if (sizeof(stype3)==ltype) { __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype3); } \
        else throw CImgIOException(_cimg_instance \
                                   "load_pandore(): Unknown pixel datatype in file '%s'.", \
                                   cimg_instance, \
                                   filename?filename:"(FILE*)"); }
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_pandore(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      CImg<charT> header(32);
      cimg::fread(header._data,12,nfile);
      if (cimg::strncasecmp("PANDORE",header,7)) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pandore(): PANDORE header not found in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      unsigned int imageid, dims[8] = { 0 };
      int ptbuf[4] = { 0 };
      cimg::fread(&imageid,1,nfile);
      const bool endian = imageid>255;
      if (endian) cimg::invert_endianness(imageid);
      cimg::fread(header._data,20,nfile);

      switch (imageid) {
      case 2 : _cimg_load_pandore_case(2,dims[1],1,1,1,unsigned char,unsigned char,unsigned char,1); break;
      case 3 : _cimg_load_pandore_case(2,dims[1],1,1,1,long,int,short,4); break;
      case 4 : _cimg_load_pandore_case(2,dims[1],1,1,1,double,float,float,4); break;
      case 5 : _cimg_load_pandore_case(3,dims[2],dims[1],1,1,unsigned char,unsigned char,unsigned char,1); break;
      case 6 : _cimg_load_pandore_case(3,dims[2],dims[1],1,1,long,int,short,4); break;
      case 7 : _cimg_load_pandore_case(3,dims[2],dims[1],1,1,double,float,float,4); break;
      case 8 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],1,unsigned char,unsigned char,unsigned char,1); break;
      case 9 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],1,long,int,short,4); break;
      case 10 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],1,double,float,float,4); break;
      case 11 : { // Region 1D
        cimg::fread(dims,3,nfile);
        if (endian) cimg::invert_endianness(dims,3);
        assign(dims[1],1,1,1);
        const unsigned siz = size();
        if (dims[2]<256) {
          unsigned char *buffer = new unsigned char[siz];
          cimg::fread(buffer,siz,nfile);
          T *ptrd = _data;
          cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
          buffer-=siz;
          delete[] buffer;
        } else {
          if (dims[2]<65536) {
            unsigned short *buffer = new unsigned short[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          } else {
            unsigned int *buffer = new unsigned int[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          }
        }
      }
        break;
      case 12 : { // Region 2D
        cimg::fread(dims,4,nfile);
        if (endian) cimg::invert_endianness(dims,4);
        assign(dims[2],dims[1],1,1);
        const size_t siz = size();
        if (dims[3]<256) {
          unsigned char *buffer = new unsigned char[siz];
          cimg::fread(buffer,siz,nfile);
          T *ptrd = _data;
          cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
          buffer-=siz;
          delete[] buffer;
        } else {
          if (dims[3]<65536) {
            unsigned short *buffer = new unsigned short[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          } else {
            unsigned int *buffer = new unsigned int[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          }
        }
      }
        break;
      case 13 : { // Region 3D
        cimg::fread(dims,5,nfile);
        if (endian) cimg::invert_endianness(dims,5);
        assign(dims[3],dims[2],dims[1],1);
        const size_t siz = size();
        if (dims[4]<256) {
          unsigned char *buffer = new unsigned char[siz];
          cimg::fread(buffer,siz,nfile);
          T *ptrd = _data;
          cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
          buffer-=siz;
          delete[] buffer;
        } else {
          if (dims[4]<65536) {
            unsigned short *buffer = new unsigned short[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          } else {
            unsigned int *buffer = new unsigned int[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          }
        }
      }
        break;
      case 16 : _cimg_load_pandore_case(4,dims[2],dims[1],1,3,unsigned char,unsigned char,unsigned char,1); break;
      case 17 : _cimg_load_pandore_case(4,dims[2],dims[1],1,3,long,int,short,4); break;
      case 18 : _cimg_load_pandore_case(4,dims[2],dims[1],1,3,double,float,float,4); break;
      case 19 : _cimg_load_pandore_case(5,dims[3],dims[2],dims[1],3,unsigned char,unsigned char,unsigned char,1); break;
      case 20 : _cimg_load_pandore_case(5,dims[3],dims[2],dims[1],3,long,int,short,4); break;
      case 21 : _cimg_load_pandore_case(5,dims[3],dims[2],dims[1],3,double,float,float,4); break;
      case 22 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],unsigned char,unsigned char,unsigned char,1); break;
      case 23 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],long,int,short,4); break;
      case 24 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],unsigned long,unsigned int,unsigned short,4); break;
      case 25 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],double,float,float,4); break;
      case 26 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],unsigned char,unsigned char,unsigned char,1); break;
      case 27 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],long,int,short,4); break;
      case 28 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],unsigned long,unsigned int,unsigned short,4); break;
      case 29 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],double,float,float,4); break;
      case 30 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],unsigned char,unsigned char,unsigned char,1);
        break;
      case 31 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],long,int,short,4); break;
      case 32 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],unsigned long,unsigned int,unsigned short,4);
        break;
      case 33 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],double,float,float,4); break;
      case 34 : { // Points 1D
        cimg::fread(ptbuf,1,nfile);
        if (endian) cimg::invert_endianness(ptbuf,1);
        assign(1); (*this)(0) = (T)ptbuf[0];
      } break;
      case 35 : { // Points 2D
        cimg::fread(ptbuf,2,nfile);
        if (endian) cimg::invert_endianness(ptbuf,2);
        assign(2); (*this)(0) = (T)ptbuf[1]; (*this)(1) = (T)ptbuf[0];
      } break;
      case 36 : { // Points 3D
        cimg::fread(ptbuf,3,nfile);
        if (endian) cimg::invert_endianness(ptbuf,3);
        assign(3); (*this)(0) = (T)ptbuf[2]; (*this)(1) = (T)ptbuf[1]; (*this)(2) = (T)ptbuf[0];
      } break;
      default :
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pandore(): Unable to load data with ID_type %u in file '%s'.",
                              cimg_instance,
                              imageid,filename?filename:"(FILE*)");
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }